

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O2

void fake_clib_func(_func_void_int_void_ptr *callback,void *user)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"before");
  std::endl<char,std::char_traits<char>>(poVar1);
  (*callback)(0x2a,user);
  poVar1 = std::operator<<((ostream *)&std::cout,"after");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void fake_clib_func(void (*callback)(int input, void *user), void *user) {
  std::cout << "before" << std::endl;
  callback(42, user);
  std::cout << "after" << std::endl;
}